

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

int uv__random(void *buf,size_t buflen)

{
  uint local_1c;
  int rc;
  size_t buflen_local;
  void *buf_local;
  
  local_1c = uv__random_getrandom(buf,buflen);
  if (local_1c == 0xffffffda) {
    local_1c = uv__random_devurandom(buf,buflen);
  }
  if ((((local_1c == 0xffffffd8) || (local_1c + 0x18 < 2)) || (local_1c == 0xfffffff3)) ||
     ((local_1c == 0xfffffffb || (0xfffffffd < local_1c)))) {
    local_1c = uv__random_sysctl(buf,buflen);
  }
  return local_1c;
}

Assistant:

static int uv__random(void* buf, size_t buflen) {
  int rc;

#if defined(__PASE__)
  rc = uv__random_readpath("/dev/urandom", buf, buflen);
#elif defined(_AIX)
  rc = uv__random_readpath("/dev/random", buf, buflen);
#elif defined(__APPLE__) || defined(__OpenBSD__) || \
     (defined(__ANDROID_API__) && __ANDROID_API__ >= 28)
  rc = uv__random_getentropy(buf, buflen);
  if (rc == UV_ENOSYS)
    rc = uv__random_devurandom(buf, buflen);
#elif defined(__NetBSD__)
  rc = uv__random_sysctl(buf, buflen);
#elif defined(__FreeBSD__) || defined(__linux__)
  rc = uv__random_getrandom(buf, buflen);
  if (rc == UV_ENOSYS)
    rc = uv__random_devurandom(buf, buflen);
# if defined(__linux__)
  switch (rc) {
    case UV_EACCES:
    case UV_EIO:
    case UV_ELOOP:
    case UV_EMFILE:
    case UV_ENFILE:
    case UV_ENOENT:
    case UV_EPERM:
      rc = uv__random_sysctl(buf, buflen);
      break;
  }
# endif
#elif defined(_WIN32)
  uv__once_init();
  rc = uv__random_rtlgenrandom(buf, buflen);
#else
  rc = uv__random_devurandom(buf, buflen);
#endif

  return rc;
}